

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void __thiscall Log_Cerr_Buffer::sync(Log_Cerr_Buffer *this)

{
  char *__s;
  Log_Class *pLVar1;
  long lVar2;
  ulong uVar3;
  string buffer;
  char *local_50 [4];
  
  pLVar1 = Nova::Log::Instance();
  if (pLVar1->suppress_cerr == false) {
    if (Nova::Log::Log_Entry::start_on_separate_line == true) {
      putchar(10);
    }
    Nova::Log::Log_Entry::start_on_separate_line = false;
    std::__cxx11::stringbuf::str();
    fputs(buffer._M_dataplus._M_p,_stderr);
    std::__cxx11::string::~string((string *)&buffer);
  }
  pLVar1 = Nova::Log::Instance();
  if (pLVar1->log_file != (FILE *)0x0) {
    if (Nova::Log::Log_Entry::log_file_start_on_separate_line == true) {
      pLVar1 = Nova::Log::Instance();
      putc(10,(FILE *)pLVar1->log_file);
    }
    Nova::Log::Log_Entry::log_file_start_on_separate_line = false;
    std::__cxx11::stringbuf::str();
    uVar3 = 0;
    do {
      if (buffer._M_string_length <= uVar3) break;
      lVar2 = std::__cxx11::string::find((char)&buffer,10);
      pLVar1 = Nova::Log::Instance();
      if (pLVar1->xml == true) {
        pLVar1 = Nova::Log::Instance();
        fputs("<error><!--",(FILE *)pLVar1->log_file);
      }
      std::__cxx11::string::substr((ulong)local_50,(ulong)&buffer);
      __s = local_50[0];
      pLVar1 = Nova::Log::Instance();
      fputs(__s,(FILE *)pLVar1->log_file);
      std::__cxx11::string::~string((string *)local_50);
      pLVar1 = Nova::Log::Instance();
      if (pLVar1->xml == true) {
        pLVar1 = Nova::Log::Instance();
        fputs("--></error>",(FILE *)pLVar1->log_file);
      }
      pLVar1 = Nova::Log::Instance();
      putc(10,(FILE *)pLVar1->log_file);
      uVar3 = lVar2 + 1;
    } while (uVar3 != 0);
    std::__cxx11::string::~string((string *)&buffer);
  }
  std::__cxx11::string::string((string *)&buffer,"",(allocator *)local_50);
  std::__cxx11::stringbuf::str((string *)this);
  std::__cxx11::string::~string((string *)&buffer);
  return;
}

Assistant:

int sync()
    {
        if(!Instance()->suppress_cerr){
            if(Log_Entry::start_on_separate_line) putchar('\n');Log_Entry::start_on_separate_line=false;
            fputs(str().c_str(),stderr);}
        if(Instance()->log_file){
            if(Log_Entry::log_file_start_on_separate_line) putc('\n',Instance()->log_file);Log_Entry::log_file_start_on_separate_line=false;
            std::string buffer=str();
            for(size_t start=0;start<buffer.length();){
                size_t end=buffer.find('\n',start);
                if(Instance()->xml) fputs("<error><!--",Instance()->log_file);
                fputs(buffer.substr(start,end-start).c_str(),Instance()->log_file);
                if(Instance()->xml) fputs("--></error>",Instance()->log_file);
                putc('\n',Instance()->log_file);
                if(end!=std::string::npos) start=end+1;
                else break;}}
        str("");return std::stringbuf::sync();
    }